

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int mz_inflate(mz_streamp pStream,int flush)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  tinfl_status tVar6;
  int in_ESI;
  long *in_RDI;
  bool bVar7;
  tinfl_status status;
  size_t orig_avail_in;
  size_t out_bytes;
  size_t in_bytes;
  mz_uint decomp_flags;
  mz_uint first_call;
  mz_uint n;
  inflate_state *pState;
  size_t *in_stack_00000200;
  mz_uint8 *in_stack_00000208;
  mz_uint8 *in_stack_00000210;
  size_t *in_stack_00000218;
  mz_uint8 *in_stack_00000220;
  tinfl_decompressor *in_stack_00000228;
  mz_uint32 in_stack_00000240;
  uint local_58;
  uint local_50;
  int local_14;
  uint local_4;
  
  if ((in_RDI == (long *)0x0) || (in_RDI[7] == 0)) {
    local_4 = 0xfffffffe;
  }
  else {
    local_14 = in_ESI;
    if (in_ESI == 1) {
      local_14 = 2;
    }
    if (((local_14 == 0) || (local_14 == 2)) || (local_14 == 4)) {
      lVar4 = in_RDI[7];
      lVar5 = in_RDI[1];
      iVar1 = *(int *)(lVar4 + 0x2b00);
      *(undefined4 *)(lVar4 + 0x2b00) = 0;
      if (*(int *)(lVar4 + 0xab0c) < 0) {
        local_4 = 0xfffffffd;
      }
      else if ((*(int *)(lVar4 + 0x2b04) == 0) || (local_14 == 4)) {
        *(uint *)(lVar4 + 0x2b04) = (uint)(local_14 == 4) | *(uint *)(lVar4 + 0x2b04);
        if ((local_14 == 4) && (iVar1 != 0)) {
          uVar2 = *(uint *)(in_RDI + 1);
          uVar3 = *(uint *)(in_RDI + 4);
          tVar6 = tinfl_decompress(in_stack_00000228,in_stack_00000220,in_stack_00000218,
                                   in_stack_00000210,in_stack_00000208,in_stack_00000200,
                                   in_stack_00000240);
          *(tinfl_status *)(lVar4 + 0xab0c) = tVar6;
          *in_RDI = *in_RDI + (ulong)uVar2;
          *(uint *)(in_RDI + 1) = (int)in_RDI[1] - uVar2;
          in_RDI[2] = (ulong)uVar2 + in_RDI[2];
          in_RDI[0xc] = (ulong)*(uint *)(lVar4 + 0x1c);
          in_RDI[3] = in_RDI[3] + (ulong)uVar3;
          *(uint *)(in_RDI + 4) = (int)in_RDI[4] - uVar3;
          in_RDI[5] = (ulong)uVar3 + in_RDI[5];
          if (tVar6 < TINFL_STATUS_DONE) {
            local_4 = 0xfffffffd;
          }
          else if (tVar6 == TINFL_STATUS_DONE) {
            local_4 = 1;
          }
          else {
            *(undefined4 *)(lVar4 + 0xab0c) = 0xffffffff;
            local_4 = 0xfffffffb;
          }
        }
        else if (*(int *)(lVar4 + 0x2afc) == 0) {
          do {
            while( true ) {
              uVar2 = *(uint *)(in_RDI + 1);
              iVar1 = *(int *)(lVar4 + 11000);
              tVar6 = tinfl_decompress(in_stack_00000228,in_stack_00000220,in_stack_00000218,
                                       in_stack_00000210,in_stack_00000208,in_stack_00000200,
                                       in_stack_00000240);
              *(tinfl_status *)(lVar4 + 0xab0c) = tVar6;
              *in_RDI = *in_RDI + (ulong)uVar2;
              *(uint *)(in_RDI + 1) = (int)in_RDI[1] - uVar2;
              in_RDI[2] = (ulong)uVar2 + in_RDI[2];
              in_RDI[0xc] = (ulong)*(uint *)(lVar4 + 0x1c);
              *(int *)(lVar4 + 0x2afc) = 0x8000 - iVar1;
              if (*(uint *)(lVar4 + 0x2afc) < *(uint *)(in_RDI + 4)) {
                local_58 = *(uint *)(lVar4 + 0x2afc);
              }
              else {
                local_58 = *(uint *)(in_RDI + 4);
              }
              memcpy((void *)in_RDI[3],(void *)(lVar4 + 0x2b0c + (ulong)*(uint *)(lVar4 + 11000)),
                     (ulong)local_58);
              in_RDI[3] = in_RDI[3] + (ulong)local_58;
              *(uint *)(in_RDI + 4) = (int)in_RDI[4] - local_58;
              in_RDI[5] = (ulong)local_58 + in_RDI[5];
              *(uint *)(lVar4 + 0x2afc) = *(int *)(lVar4 + 0x2afc) - local_58;
              *(uint *)(lVar4 + 11000) = *(int *)(lVar4 + 11000) + local_58 & 0x7fff;
              if (tVar6 < TINFL_STATUS_DONE) {
                return -3;
              }
              if ((tVar6 == TINFL_STATUS_NEEDS_MORE_INPUT) && ((int)lVar5 == 0)) {
                return -5;
              }
              if (local_14 != 4) break;
              if (tVar6 == TINFL_STATUS_DONE) {
                if (*(int *)(lVar4 + 0x2afc) == 0) {
                  return 1;
                }
                return -5;
              }
              if ((int)in_RDI[4] == 0) {
                return -5;
              }
            }
          } while ((((tVar6 != TINFL_STATUS_DONE) && ((int)in_RDI[1] != 0)) && ((int)in_RDI[4] != 0)
                   ) && (*(int *)(lVar4 + 0x2afc) == 0));
          bVar7 = false;
          if (tVar6 == TINFL_STATUS_DONE) {
            bVar7 = *(int *)(lVar4 + 0x2afc) == 0;
          }
          local_4 = (uint)bVar7;
        }
        else {
          if (*(uint *)(lVar4 + 0x2afc) < *(uint *)(in_RDI + 4)) {
            local_50 = *(uint *)(lVar4 + 0x2afc);
          }
          else {
            local_50 = *(uint *)(in_RDI + 4);
          }
          memcpy((void *)in_RDI[3],(void *)(lVar4 + 0x2b0c + (ulong)*(uint *)(lVar4 + 11000)),
                 (ulong)local_50);
          in_RDI[3] = in_RDI[3] + (ulong)local_50;
          *(uint *)(in_RDI + 4) = (int)in_RDI[4] - local_50;
          in_RDI[5] = (ulong)local_50 + in_RDI[5];
          *(uint *)(lVar4 + 0x2afc) = *(int *)(lVar4 + 0x2afc) - local_50;
          *(uint *)(lVar4 + 11000) = *(int *)(lVar4 + 11000) + local_50 & 0x7fff;
          bVar7 = false;
          if (*(int *)(lVar4 + 0xab0c) == 0) {
            bVar7 = *(int *)(lVar4 + 0x2afc) == 0;
          }
          local_4 = (uint)bVar7;
        }
      }
      else {
        local_4 = 0xfffffffe;
      }
    }
    else {
      local_4 = 0xfffffffe;
    }
  }
  return local_4;
}

Assistant:

int mz_inflate(mz_streamp pStream, int flush) {
  inflate_state *pState;
  mz_uint n, first_call, decomp_flags = TINFL_FLAG_COMPUTE_ADLER32;
  size_t in_bytes, out_bytes, orig_avail_in;
  tinfl_status status;

  if ((!pStream) || (!pStream->state))
    return MZ_STREAM_ERROR;
  if (flush == MZ_PARTIAL_FLUSH)
    flush = MZ_SYNC_FLUSH;
  if ((flush) && (flush != MZ_SYNC_FLUSH) && (flush != MZ_FINISH))
    return MZ_STREAM_ERROR;

  pState = (inflate_state *)pStream->state;
  if (pState->m_window_bits > 0)
    decomp_flags |= TINFL_FLAG_PARSE_ZLIB_HEADER;
  orig_avail_in = pStream->avail_in;

  first_call = pState->m_first_call;
  pState->m_first_call = 0;
  if (pState->m_last_status < 0)
    return MZ_DATA_ERROR;

  if (pState->m_has_flushed && (flush != MZ_FINISH))
    return MZ_STREAM_ERROR;
  pState->m_has_flushed |= (flush == MZ_FINISH);

  if ((flush == MZ_FINISH) && (first_call)) {
    // MZ_FINISH on the first call implies that the input and output buffers are
    // large enough to hold the entire compressed/decompressed file.
    decomp_flags |= TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF;
    in_bytes = pStream->avail_in;
    out_bytes = pStream->avail_out;
    status = tinfl_decompress(&pState->m_decomp, pStream->next_in, &in_bytes,
                              pStream->next_out, pStream->next_out, &out_bytes,
                              decomp_flags);
    pState->m_last_status = status;
    pStream->next_in += (mz_uint)in_bytes;
    pStream->avail_in -= (mz_uint)in_bytes;
    pStream->total_in += (mz_uint)in_bytes;
    pStream->adler = tinfl_get_adler32(&pState->m_decomp);
    pStream->next_out += (mz_uint)out_bytes;
    pStream->avail_out -= (mz_uint)out_bytes;
    pStream->total_out += (mz_uint)out_bytes;

    if (status < 0)
      return MZ_DATA_ERROR;
    else if (status != TINFL_STATUS_DONE) {
      pState->m_last_status = TINFL_STATUS_FAILED;
      return MZ_BUF_ERROR;
    }
    return MZ_STREAM_END;
  }
  // flush != MZ_FINISH then we must assume there's more input.
  if (flush != MZ_FINISH)
    decomp_flags |= TINFL_FLAG_HAS_MORE_INPUT;

  if (pState->m_dict_avail) {
    n = MZ_MIN(pState->m_dict_avail, pStream->avail_out);
    memcpy(pStream->next_out, pState->m_dict + pState->m_dict_ofs, n);
    pStream->next_out += n;
    pStream->avail_out -= n;
    pStream->total_out += n;
    pState->m_dict_avail -= n;
    pState->m_dict_ofs = (pState->m_dict_ofs + n) & (TINFL_LZ_DICT_SIZE - 1);
    return ((pState->m_last_status == TINFL_STATUS_DONE) &&
            (!pState->m_dict_avail))
               ? MZ_STREAM_END
               : MZ_OK;
  }

  for (;;) {
    in_bytes = pStream->avail_in;
    out_bytes = TINFL_LZ_DICT_SIZE - pState->m_dict_ofs;

    status = tinfl_decompress(
        &pState->m_decomp, pStream->next_in, &in_bytes, pState->m_dict,
        pState->m_dict + pState->m_dict_ofs, &out_bytes, decomp_flags);
    pState->m_last_status = status;

    pStream->next_in += (mz_uint)in_bytes;
    pStream->avail_in -= (mz_uint)in_bytes;
    pStream->total_in += (mz_uint)in_bytes;
    pStream->adler = tinfl_get_adler32(&pState->m_decomp);

    pState->m_dict_avail = (mz_uint)out_bytes;

    n = MZ_MIN(pState->m_dict_avail, pStream->avail_out);
    memcpy(pStream->next_out, pState->m_dict + pState->m_dict_ofs, n);
    pStream->next_out += n;
    pStream->avail_out -= n;
    pStream->total_out += n;
    pState->m_dict_avail -= n;
    pState->m_dict_ofs = (pState->m_dict_ofs + n) & (TINFL_LZ_DICT_SIZE - 1);

    if (status < 0)
      return MZ_DATA_ERROR; // Stream is corrupted (there could be some
                            // uncompressed data left in the output dictionary -
                            // oh well).
    else if ((status == TINFL_STATUS_NEEDS_MORE_INPUT) && (!orig_avail_in))
      return MZ_BUF_ERROR; // Signal caller that we can't make forward progress
                           // without supplying more input or by setting flush
                           // to MZ_FINISH.
    else if (flush == MZ_FINISH) {
      // The output buffer MUST be large to hold the remaining uncompressed data
      // when flush==MZ_FINISH.
      if (status == TINFL_STATUS_DONE)
        return pState->m_dict_avail ? MZ_BUF_ERROR : MZ_STREAM_END;
      // status here must be TINFL_STATUS_HAS_MORE_OUTPUT, which means there's
      // at least 1 more byte on the way. If there's no more room left in the
      // output buffer then something is wrong.
      else if (!pStream->avail_out)
        return MZ_BUF_ERROR;
    } else if ((status == TINFL_STATUS_DONE) || (!pStream->avail_in) ||
               (!pStream->avail_out) || (pState->m_dict_avail))
      break;
  }

  return ((status == TINFL_STATUS_DONE) && (!pState->m_dict_avail))
             ? MZ_STREAM_END
             : MZ_OK;
}